

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  bool bVar1;
  char *pcVar2;
  Value local_e8;
  Value local_c0;
  Value local_88;
  uint local_5c;
  uint local_58;
  UInt last_digit;
  UInt digit;
  Char c;
  LargestUInt value;
  ulong uStack_40;
  UInt max_last_digit;
  LargestUInt threshold;
  char *pcStack_30;
  bool isNegative;
  Location current;
  Value *decoded_local;
  Token *token_local;
  OurReader *this_local;
  
  pcStack_30 = token->start_;
  threshold._7_1_ = *pcStack_30 == '-';
  if ((bool)threshold._7_1_) {
    pcStack_30 = pcStack_30 + 1;
  }
  uStack_40 = 0x1999999999999999;
  if ((bool)threshold._7_1_) {
    uStack_40 = 0xccccccccccccccc;
  }
  value._4_4_ = 5;
  if ((bool)threshold._7_1_) {
    value._4_4_ = 8;
  }
  _digit = 0;
  while( true ) {
    current = (Location)decoded;
    decoded_local = (Value *)token;
    token_local = (Token *)this;
    if (token->end_ <= pcStack_30) {
      if ((bool)threshold._7_1_) {
        local_5c = (int)_digit + (int)(_digit / 10) * -10;
        Value::Value(&local_88,(_digit / 10) * -10 - (ulong)local_5c);
        Value::operator=((Value *)current,&local_88);
        Value::~Value(&local_88);
      }
      else if (_digit < 0x8000000000000000) {
        Value::Value(&local_c0,_digit);
        Value::operator=((Value *)current,&local_c0);
        Value::~Value(&local_c0);
      }
      else {
        Value::Value(&local_e8,_digit);
        Value::operator=((Value *)current,&local_e8);
        Value::~Value(&local_e8);
      }
      return true;
    }
    pcVar2 = pcStack_30 + 1;
    last_digit._3_1_ = *pcStack_30;
    pcStack_30 = pcVar2;
    if ((last_digit._3_1_ < '0') || ('9' < last_digit._3_1_)) break;
    local_58 = (int)last_digit._3_1_ - 0x30;
    if ((uStack_40 <= _digit) &&
       (((uStack_40 < _digit || (pcVar2 != token->end_)) || (value._4_4_ < local_58)))) {
      bVar1 = decodeDouble(this,token,decoded);
      return bVar1;
    }
    _digit = _digit * 10 + (ulong)local_58;
  }
  bVar1 = decodeDouble(this,token,decoded);
  return bVar1;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  const bool isNegative = *current == '-';
  if (isNegative) {
    ++current;
  }

  // We assume we can represent the largest and smallest integer types as
  // unsigned integers with separate sign. This is only true if they can fit
  // into an unsigned integer.
  static_assert(Value::maxLargestInt <= Value::maxLargestUInt,
                "Int must be smaller than UInt");

  // We need to convert minLargestInt into a positive number. The easiest way
  // to do this conversion is to assume our "threshold" value of minLargestInt
  // divided by 10 can fit in maxLargestInt when absolute valued. This should
  // be a safe assumption.
  static_assert(Value::minLargestInt <= -Value::maxLargestInt,
                "The absolute value of minLargestInt must be greater than or "
                "equal to maxLargestInt");
  static_assert(Value::minLargestInt / 10 >= -Value::maxLargestInt,
                "The absolute value of minLargestInt must be only 1 magnitude "
                "larger than maxLargest Int");

  static constexpr Value::LargestUInt positive_threshold =
      Value::maxLargestUInt / 10;
  static constexpr Value::UInt positive_last_digit = Value::maxLargestUInt % 10;

  // For the negative values, we have to be more careful. Since typically
  // -Value::minLargestInt will cause an overflow, we first divide by 10 and
  // then take the inverse. This assumes that minLargestInt is only a single
  // power of 10 different in magnitude, which we check above. For the last
  // digit, we take the modulus before negating for the same reason.
  static constexpr auto negative_threshold =
      Value::LargestUInt(-(Value::minLargestInt / 10));
  static constexpr auto negative_last_digit =
      Value::UInt(-(Value::minLargestInt % 10));

  const Value::LargestUInt threshold =
      isNegative ? negative_threshold : positive_threshold;
  const Value::UInt max_last_digit =
      isNegative ? negative_last_digit : positive_last_digit;

  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);

    const auto digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, meaing value == threshold,
      // b) this is the last digit, or
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > max_last_digit) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }

  if (isNegative) {
    // We use the same magnitude assumption here, just in case.
    const auto last_digit = static_cast<Value::UInt>(value % 10);
    decoded = -Value::LargestInt(value / 10) * 10 - last_digit;
  } else if (value <= Value::LargestUInt(Value::maxLargestInt)) {
    decoded = Value::LargestInt(value);
  } else {
    decoded = value;
  }

  return true;
}